

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogCleanup(void)

{
  int test_ret;
  
  xmlCatalogCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlCatalogCleanup(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)


        xmlCatalogCleanup();
        call_tests++;
        xmlResetLastError();
    function_tests++;
#endif

    return(test_ret);
}